

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

uint __thiscall dynamicgraph::command::Value::unsignedValue(Value *this)

{
  ExceptionAbstract *this_00;
  allocator<char> local_39;
  string local_38;
  int local_14;
  Value *local_10;
  Value *this_local;
  
  if (this->type_ == UNSIGNED) {
    return *this->value_;
  }
  local_10 = this;
  this_00 = (ExceptionAbstract *)__cxa_allocate_exception(0x30);
  local_14 = 700;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"value is not an unsigned int",&local_39);
  ExceptionAbstract::ExceptionAbstract(this_00,&local_14,&local_38);
  __cxa_throw(this_00,&ExceptionAbstract::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

unsigned Value::unsignedValue() const {
  if (type_ == UNSIGNED) return *((const unsigned *)value_);
  throw ExceptionAbstract(ExceptionAbstract::TOOLS,
                          "value is not an unsigned int");
}